

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings_pack.cpp
# Opt level: O2

int __thiscall libtorrent::setting_by_name(libtorrent *this,string_view key)

{
  char *pcVar1;
  bool bVar2;
  size_t sVar3;
  int k;
  ulong uVar4;
  undefined8 *puVar5;
  long lVar6;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  
  __x._M_str = (char *)key._M_len;
  puVar5 = &(anonymous_namespace)::str_settings;
  for (uVar4 = 0; uVar4 != 0xd; uVar4 = uVar4 + 1) {
    pcVar1 = (char *)*puVar5;
    sVar3 = strlen(pcVar1);
    __y._M_str = pcVar1;
    __y._M_len = sVar3;
    __x._M_len = (size_t)this;
    bVar2 = ::std::operator!=(__x,__y);
    if (!bVar2) goto LAB_002be3f6;
    puVar5 = puVar5 + 7;
  }
  uVar4 = 0x4000;
  for (lVar6 = 0; lVar6 != 0x13e0; lVar6 = lVar6 + 0x20) {
    pcVar1 = *(char **)((long)&(anonymous_namespace)::int_settings + lVar6);
    sVar3 = strlen(pcVar1);
    __y_00._M_str = pcVar1;
    __y_00._M_len = sVar3;
    __x_00._M_str = __x._M_str;
    __x_00._M_len = (size_t)this;
    bVar2 = ::std::operator!=(__x_00,__y_00);
    if (!bVar2) goto LAB_002be3f6;
    uVar4 = (ulong)((int)uVar4 + 1);
  }
  uVar4 = 0x8000;
  for (lVar6 = 0; lVar6 != 0xa80; lVar6 = lVar6 + 0x20) {
    pcVar1 = *(char **)((long)&(anonymous_namespace)::bool_settings + lVar6);
    sVar3 = strlen(pcVar1);
    __y_01._M_str = pcVar1;
    __y_01._M_len = sVar3;
    __x_01._M_str = __x._M_str;
    __x_01._M_len = (size_t)this;
    bVar2 = ::std::operator!=(__x_01,__y_01);
    if (!bVar2) goto LAB_002be3f6;
    uVar4 = (ulong)((int)uVar4 + 1);
  }
  __y_02._M_str = "peer_tos";
  __y_02._M_len = 8;
  __x_02._M_str = __x._M_str;
  __x_02._M_len = (size_t)this;
  bVar2 = ::std::operator==(__x_02,__y_02);
  uVar4 = (ulong)(bVar2 - 1 | 0x4028);
LAB_002be3f6:
  return (int)uVar4;
}

Assistant:

int setting_by_name(string_view const key)
	{
		for (int k = 0; k < str_settings.end_index(); ++k)
		{
			if (key != str_settings[k].name) continue;
			return settings_pack::string_type_base + k;
		}
		for (int k = 0; k < int_settings.end_index(); ++k)
		{
			if (key != int_settings[k].name) continue;
			return settings_pack::int_type_base + k;
		}
		for (int k = 0; k < bool_settings.end_index(); ++k)
		{
			if (key != bool_settings[k].name) continue;
			return settings_pack::bool_type_base + k;
		}

		// backwards compatibility with previous name
		if (key == "peer_tos")
			return settings_pack::peer_dscp;

		return -1;
	}